

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTerminatorSymbol::~IfcTerminatorSymbol(IfcTerminatorSymbol *this)

{
  void *pvVar1;
  long *plVar2;
  long lVar3;
  void *pvVar4;
  
  lVar3 = *(long *)(*(long *)&(this->super_IfcAnnotationSymbolOccurrence).
                              super_IfcAnnotationOccurrence.super_IfcStyledItem + -0x18);
  pvVar1 = &(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
            super_IfcStyledItem.field_0x0 + lVar3;
  plVar2 = (long *)((this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
                    super_IfcStyledItem.Name.ptr.field_2._M_local_buf + lVar3);
  plVar2[-0xb] = 0x947cc8;
  plVar2[10] = 0x947d18;
  plVar2[-9] = 0x947cf0;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  pvVar4 = *(void **)((long)pvVar1 + 0x30);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,*(long *)((long)pvVar1 + 0x40) - (long)pvVar4);
  }
  operator_delete(pvVar1,0xc0);
  return;
}

Assistant:

IfcTerminatorSymbol() : Object("IfcTerminatorSymbol") {}